

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_boolean_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h_00;
  global_object *pgVar1;
  gc_heap_ptr<mjs::gc_string> *name;
  boolean_object *pbVar2;
  anon_class_32_1_257c72e9_for_f local_190;
  string local_170;
  gc_heap_ptr<mjs::object> local_160;
  anon_class_32_1_257c72e9_for_f local_150;
  string local_130;
  gc_heap_ptr<mjs::object> local_120;
  undefined1 local_110 [8];
  anon_class_32_2_842af841 get_bool_obj;
  value local_e0;
  string local_b8;
  anon_class_16_1_f1e7abc2_for_f local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [8];
  gc_heap_ptr<mjs::function_object> c;
  gc_heap_ptr<mjs::object> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::boolean_object> prototype;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  h_00 = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  prototype.super_gc_heap_ptr_untyped._8_8_ = h_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"Boolean");
  string::string(&local_40,h_00,&local_50);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0xb])(&local_60);
  c.super_gc_heap_ptr_untyped.pos_._3_1_ = 0;
  gc_heap::make<mjs::boolean_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,bool>
            ((gc_heap *)local_30,(string *)h_00,(gc_heap_ptr<mjs::object> *)&local_40,
             (bool *)&local_60);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_60);
  string::~string(&local_40);
  gc_heap_ptr<mjs::boolean_object>::operator->((gc_heap_ptr<mjs::boolean_object> *)local_30);
  object::class_name((object *)local_98);
  name = string::unsafe_raw_get((string *)local_98);
  make_function<mjs::make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
            ((mjs *)local_80,global,(anon_class_1_0_00000001_for_f *)(local_98 + 0x17),name,1);
  string::~string((string *)local_98);
  gc_heap_ptr<mjs::boolean_object>::gc_heap_ptr
            (&local_a8.prototype,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  make_constructable<mjs::make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
            (global,(gc_heap_ptr<mjs::function_object> *)local_80,&local_a8);
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_1::~__1((__1 *)&local_a8);
  pbVar2 = gc_heap_ptr<mjs::boolean_object>::operator->
                     ((gc_heap_ptr<mjs::boolean_object> *)local_30);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0x13])(&local_b8,pgVar1,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)&get_bool_obj.prototype.super_gc_heap_ptr_untyped.pos_,
             (gc_heap_ptr<mjs::function_object> *)local_80);
  value::value(&local_e0,(object_ptr *)&get_bool_obj.prototype.super_gc_heap_ptr_untyped.pos_);
  (*(pbVar2->super_object)._vptr_object[1])(pbVar2,&local_b8,&local_e0,2);
  value::~value(&local_e0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)&get_bool_obj.prototype.super_gc_heap_ptr_untyped.pos_);
  string::~string(&local_b8);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_110,global);
  gc_heap_ptr<mjs::boolean_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::boolean_object> *)&get_bool_obj.global.super_gc_heap_ptr_untyped.pos_
             ,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::boolean_object,void>
            (&local_120,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0x13])(&local_130,pgVar1,"toString");
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::__3
            ((__3 *)&local_150,(anon_class_32_2_842af841 *)local_110);
  put_native_function<mjs::make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__2>
            (global,&local_120,&local_130,&local_150,0);
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&local_150);
  string::~string(&local_130);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_120);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::boolean_object,void>
            (&local_160,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0x13])(&local_170,pgVar1,"valueOf");
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::__3
            ((__3 *)&local_190,(anon_class_32_2_842af841 *)local_110);
  put_native_function<mjs::make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__4>
            (global,&local_160,&local_170,&local_190,0);
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_4::~__4((__4 *)&local_190);
  string::~string(&local_170);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_160);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_80);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::boolean_object,void>
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::boolean_object> *)local_30);
  make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::~__3((__3 *)local_110);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_80);
  gc_heap_ptr<mjs::boolean_object>::~gc_heap_ptr((gc_heap_ptr<mjs::boolean_object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_boolean_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<boolean_object>(string{h, "Boolean"}, global->object_prototype(), false);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{!args.empty() && to_boolean(args.front())};
    },  prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_boolean(prototype, !args.empty() && to_boolean(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    auto get_bool_obj = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Boolean");
        return gc_heap_ptr<boolean_object>{this_.object_value()};
    };

    put_native_function(global, prototype, global->common_string("toString"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{string{o.heap(), o->boolean_value() ? L"true" : L"false"}};
    }, 0);

    put_native_function(global, prototype, global->common_string("valueOf"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{o->boolean_value()};
    }, 0);

    return { c, prototype };
}